

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  _func_int **pp_Var1;
  undefined4 in_register_0000000c;
  long lVar2;
  Directory *pDVar3;
  Directory *extraout_RDX;
  _func_int **pp_Var5;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  uint in_R8D;
  Mutex *this_00;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar6;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar7;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_50 [24];
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_38;
  Directory *pDVar4;
  
  lVar2 = CONCAT44(in_register_0000000c,mode);
  pDVar3 = (Directory *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  if (lVar2 == 1) {
    this_00 = (Mutex *)&name_00.content.ptr[1].ptr;
    local_50[0] = 0;
    kj::_::Mutex::lock(this_00,0);
    local_38 = name_00.content.ptr + 3;
    pp_Var1 = (((ReadableFile *)&pDVar3[1].super_ReadableDirectory)->super_FsNode)._vptr_FsNode;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x229f1b;
    }
    else {
      pp_Var5 = (((ReadableFile *)&pDVar3->super_ReadableDirectory)->super_FsNode)._vptr_FsNode;
    }
    name.content.size_ = (size_t)pp_Var5;
    name.content.ptr = (char *)local_38;
    local_50._16_8_ = this_00;
    Impl::openEntry((Impl *)local_50,name,(int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    if (CONCAT71(local_50._1_7_,local_50[0]) == 0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      MVar6 = asFile(this,name_00.content.ptr,(EntryImpl *)(local_50 + 0x10),
                     (WriteMode)CONCAT71(local_50._1_7_,local_50[0]));
      pDVar4 = (Directory *)MVar6.ptr.ptr;
      this_00 = (Mutex *)local_50._16_8_;
      if ((Mutex *)local_50._16_8_ == (Mutex *)0x0) goto LAB_001efb00;
    }
    kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    pDVar4 = extraout_RDX_01;
    goto LAB_001efb00;
  }
  if (lVar2 == 0) {
    if ((in_R8D & 2) == 0) {
      pDVar4 = pDVar3;
      if ((in_R8D & 1) != 0) goto LAB_001efae6;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x477,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x473,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)local_50);
    pDVar4 = extraout_RDX;
  }
  else {
    pp_Var1 = (((ReadableFile *)&pDVar3[1].super_ReadableDirectory)->super_FsNode)._vptr_FsNode;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x229f1b;
    }
    else {
      pp_Var5 = (((ReadableFile *)&pDVar3->super_ReadableDirectory)->super_FsNode)._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var5;
    MVar7 = tryGetParent((InMemoryDirectory *)local_50,name_00,
                         (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    pDVar4 = MVar7.ptr.ptr;
    if ((InMemoryFileFactory *)local_50._8_8_ != (InMemoryFileFactory *)0x0) {
      (**(code **)(*(_func_int **)local_50._8_8_ + 0x68))
                (this,local_50._8_8_,pDVar3 + 3,lVar2 + -1,in_R8D);
      (*(code *)**(undefined8 **)CONCAT71(local_50._1_7_,local_50[0]))
                ((undefined8 *)CONCAT71(local_50._1_7_,local_50[0]),
                 (InMemoryFileFactory *)
                 (local_50._8_8_ + *(long *)(*(_func_int **)local_50._8_8_ + -0x10)));
      pDVar4 = extraout_RDX_00;
      goto LAB_001efb00;
    }
LAB_001efae6:
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
LAB_001efb00:
  MVar6.ptr.ptr = (File *)pDVar4;
  MVar6.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar6.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return kj::none; }
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, entry, mode);
      } else {
        return kj::none;
      }
    }